

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void quantize_row_q5_K_ref(float *x,block_q5_K *y,int64_t k)

{
  block_q5_K *pbVar1;
  ggml_fp16_t gVar2;
  ggml_fp16_t gVar3;
  int l;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  int j_3;
  byte bVar11;
  byte bVar12;
  int j_2;
  float *pfVar13;
  int j;
  long lVar14;
  uint8_t *puVar15;
  float fVar16;
  float in_XMM1_Da;
  float fVar17;
  uint8_t m;
  uint8_t sc;
  float local_24c;
  float *local_248;
  uint8_t *local_240;
  long local_238;
  block_q5_K *local_230;
  long local_228;
  block_q5_K *local_220;
  float scales [8];
  float mins [8];
  uint8_t Laux [32];
  float weights [32];
  uint8_t L [256];
  
  local_238 = 0;
  local_228 = k / 0x100;
  if (k / 0x100 < 1) {
    local_228 = local_238;
  }
  local_240 = y->scales + 4;
  puVar15 = y->qh;
  local_230 = y;
  for (; local_238 != local_228; local_238 = local_238 + 1) {
    fVar17 = 0.0;
    pfVar13 = x;
    local_24c = 0.0;
    for (lVar14 = 0; lVar4 = local_238, lVar14 != 8; lVar14 = lVar14 + 1) {
      fVar16 = 0.0;
      for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
        in_XMM1_Da = pfVar13[lVar4] * pfVar13[lVar4];
        fVar16 = fVar16 + in_XMM1_Da;
      }
      fVar16 = fVar16 * 0.03125;
      local_248 = (float *)CONCAT44(local_248._4_4_,fVar17);
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
      }
      else {
        fVar16 = SQRT(fVar16);
      }
      for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
        in_XMM1_Da = ABS(pfVar13[lVar4]) + fVar16;
        weights[lVar4] = in_XMM1_Da;
      }
      fVar17 = make_qkx2_quants(0x20,0x1f,x + lVar14 * 0x20,weights,L + lVar14 * 0x20,mins + lVar14,
                                Laux,-0.5,in_XMM1_Da,0xf,false);
      scales[lVar14] = fVar17;
      if (fVar17 <= local_248._0_4_) {
        fVar17 = local_248._0_4_;
      }
      in_XMM1_Da = mins[lVar14];
      if (in_XMM1_Da <= local_24c) {
        in_XMM1_Da = local_24c;
      }
      pfVar13 = pfVar13 + 0x20;
      local_24c = in_XMM1_Da;
    }
    in_XMM1_Da = (float)(-(uint)(0.0 < local_24c) & (uint)(63.0 / local_24c));
    for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
      fVar16 = scales[uVar5] * (float)(-(uint)(0.0 < fVar17) & (uint)(63.0 / fVar17)) + 12582912.0;
      bVar6 = SUB41(fVar16,0);
      if (0x3e < ((uint)fVar16 & 0xff)) {
        bVar6 = 0x3f;
      }
      uVar8 = (uint)(mins[uVar5] * in_XMM1_Da + 12582912.0) & 0xff;
      if (0x3e < uVar8) {
        uVar8 = 0x3f;
      }
      if (uVar5 < 4) {
        local_240[uVar5 - 4] = bVar6;
        local_240[uVar5] = (byte)uVar8;
      }
      else {
        local_240[uVar5] = (byte)(uVar8 << 4) | bVar6 & 0xf;
        local_240[uVar5 - 8] = local_240[uVar5 - 8] | (bVar6 & 0x30) << 2;
        local_240[uVar5 - 4] = local_240[uVar5 - 4] | ((byte)uVar8 & 0x30) << 2;
      }
    }
    gVar2 = ggml_compute_fp32_to_fp16(fVar17 / 63.0);
    local_220 = local_230 + lVar4;
    pbVar1 = local_230 + lVar4;
    (pbVar1->field_0).field_0.d = gVar2;
    gVar3 = ggml_compute_fp32_to_fp16(local_24c / 63.0);
    (pbVar1->field_0).field_0.dmin = gVar3;
    local_24c = ggml_table_f32_f16[gVar2];
    puVar9 = L;
    local_248 = x;
    for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
      get_scale_min_k4((int)lVar14,pbVar1->scales,&sc,&m);
      fVar17 = (float)sc * local_24c;
      if ((fVar17 != 0.0) || (NAN(fVar17))) {
        in_XMM1_Da = (float)m * ggml_table_f32_f16[gVar3];
        for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
          uVar8 = (uint)((x[lVar4] + in_XMM1_Da) / fVar17 + 12582912.0) & 0x7fffff;
          if (0x40001e < uVar8) {
            uVar8 = 0x40001f;
          }
          if (uVar8 < 0x400001) {
            uVar8 = 0;
          }
          puVar9[lVar4] = (uint8_t)uVar8;
        }
      }
      puVar9 = puVar9 + 0x20;
      x = x + 0x20;
    }
    puVar9 = local_220->qs;
    local_220->qh[0x10] = '\0';
    local_220->qh[0x11] = '\0';
    local_220->qh[0x12] = '\0';
    local_220->qh[0x13] = '\0';
    local_220->qh[0x14] = '\0';
    local_220->qh[0x15] = '\0';
    local_220->qh[0x16] = '\0';
    local_220->qh[0x17] = '\0';
    local_220->qh[0x18] = '\0';
    local_220->qh[0x19] = '\0';
    local_220->qh[0x1a] = '\0';
    local_220->qh[0x1b] = '\0';
    local_220->qh[0x1c] = '\0';
    local_220->qh[0x1d] = '\0';
    local_220->qh[0x1e] = '\0';
    local_220->qh[0x1f] = '\0';
    local_220->qh[0] = '\0';
    local_220->qh[1] = '\0';
    local_220->qh[2] = '\0';
    local_220->qh[3] = '\0';
    local_220->qh[4] = '\0';
    local_220->qh[5] = '\0';
    local_220->qh[6] = '\0';
    local_220->qh[7] = '\0';
    local_220->qh[8] = '\0';
    local_220->qh[9] = '\0';
    local_220->qh[10] = '\0';
    local_220->qh[0xb] = '\0';
    local_220->qh[0xc] = '\0';
    local_220->qh[0xd] = '\0';
    local_220->qh[0xe] = '\0';
    local_220->qh[0xf] = '\0';
    bVar6 = 2;
    bVar7 = 1;
    puVar10 = L + 0x20;
    for (uVar5 = 0; uVar5 < 0x100; uVar5 = uVar5 + 0x40) {
      for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
        bVar11 = puVar10[lVar14 + -0x20];
        if (0xf < bVar11) {
          bVar11 = bVar11 - 0x10;
          puVar15[lVar14] = puVar15[lVar14] | bVar7;
        }
        bVar12 = puVar10[lVar14];
        if (0xf < bVar12) {
          bVar12 = bVar12 - 0x10;
          puVar15[lVar14] = puVar15[lVar14] | bVar6;
        }
        puVar9[lVar14] = bVar12 << 4 | bVar11;
      }
      bVar7 = bVar7 << 2;
      bVar6 = bVar6 << 2;
      puVar9 = puVar9 + 0x20;
      puVar10 = puVar10 + 0x40;
    }
    x = local_248 + 0x100;
    local_240 = local_240 + 0xb0;
    puVar15 = puVar15 + 0xb0;
  }
  return;
}

Assistant:

void quantize_row_q5_K_ref(const float * GGML_RESTRICT x, block_q5_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    uint8_t L[QK_K];
    float mins[QK_K/32];
    float scales[QK_K/32];
    float weights[32];
    uint8_t Laux[32];

    for (int i = 0; i < nb; i++) {
        float max_scale = 0; // as we are deducting the min, scales are always positive
        float max_min = 0;
        for (int j = 0; j < QK_K/32; ++j) {
            //scales[j] = make_qkx1_quants(32, 31, x + 32*j, L + 32*j, &mins[j], 9, 0.5f);
            float sum_x2 = 0;
            for (int l = 0; l < 32; ++l) sum_x2 += x[32*j + l] * x[32*j + l];
            float av_x = sqrtf(sum_x2/32);
            for (int l = 0; l < 32; ++l) weights[l] = av_x + fabsf(x[32*j + l]);
            scales[j] = make_qkx2_quants(32, 31, x + 32*j, weights, L + 32*j, &mins[j], Laux, -0.5f, 0.1f, 15, false);
            float scale = scales[j];
            if (scale > max_scale) {
                max_scale = scale;
            }
            float min = mins[j];
            if (min > max_min) {
                max_min = min;
            }
        }

        float inv_scale = max_scale > 0 ? 63.f/max_scale : 0.f;
        float inv_min   = max_min   > 0 ? 63.f/max_min   : 0.f;
        for (int j = 0; j < QK_K/32; ++j) {
            uint8_t ls = nearest_int(inv_scale*scales[j]);
            uint8_t lm = nearest_int(inv_min*mins[j]);
            ls = MIN(63, ls);
            lm = MIN(63, lm);
            if (j < 4) {
                y[i].scales[j] = ls;
                y[i].scales[j+4] = lm;
            } else {
                y[i].scales[j+4] = (ls & 0xF) | ((lm & 0xF) << 4);
                y[i].scales[j-4] |= ((ls >> 4) << 6);
                y[i].scales[j-0] |= ((lm >> 4) << 6);
            }
        }
        y[i].d = GGML_FP32_TO_FP16(max_scale/63.f);
        y[i].dmin = GGML_FP32_TO_FP16(max_min/63.f);

        uint8_t sc, m;
        for (int j = 0; j < QK_K/32; ++j) {
            get_scale_min_k4(j, y[i].scales, &sc, &m);
            const float d = GGML_FP16_TO_FP32(y[i].d) * sc;
            if (!d) continue;
            const float dm = GGML_FP16_TO_FP32(y[i].dmin) * m;
            for (int ii = 0; ii < 32; ++ii) {
                int l = nearest_int((x[32*j + ii] + dm)/d);
                l = MAX(0, MIN(31, l));
                L[32*j + ii] = l;
            }
        }

        uint8_t * GGML_RESTRICT qh = y[i].qh;
        uint8_t * GGML_RESTRICT ql = y[i].qs;
        memset(qh, 0, QK_K/8);

        uint8_t m1 = 1, m2 = 2;
        for (int n = 0; n < QK_K; n += 64) {
            for (int j = 0; j < 32; ++j) {
                int l1 = L[n + j];
                if (l1 > 15) {
                    l1 -= 16; qh[j] |= m1;
                }
                int l2 = L[n + j + 32];
                if (l2 > 15) {
                    l2 -= 16; qh[j] |= m2;
                }
                ql[j] = l1 | (l2 << 4);
            }
            m1 <<= 2; m2 <<= 2;
            ql += 32;
        }

        x += QK_K;
    }
}